

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSubdirCommand.cxx
# Opt level: O2

bool __thiscall
cmSubdirCommand::InitialPass
          (cmSubdirCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  bool bVar1;
  byte bVar2;
  pointer pbVar3;
  undefined7 extraout_var;
  char *pcVar4;
  undefined8 in_RCX;
  pointer __lhs;
  string binPath;
  string srcPath;
  allocator local_e1;
  undefined4 local_e0;
  undefined4 local_dc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  __lhs = (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  pbVar3 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (__lhs == pbVar3) {
    std::__cxx11::string::string
              ((string *)&local_90,"called with incorrect number of arguments",
               (allocator *)&local_b0);
    cmCommand::SetError(&this->super_cmCommand,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    bVar2 = 0;
  }
  else {
    local_e0 = (undefined4)CONCAT71((int7)((ulong)in_RCX >> 8),1);
    local_dc = 0;
    local_d8 = args;
    for (; __lhs != pbVar3; __lhs = __lhs + 1) {
      bVar1 = std::operator==(__lhs,"EXCLUDE_FROM_ALL");
      if (bVar1) {
        local_dc = (undefined4)CONCAT71(extraout_var,1);
      }
      else {
        bVar1 = std::operator==(__lhs,"PREORDER");
        if (!bVar1) {
          pcVar4 = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
          std::__cxx11::string::string((string *)&local_d0,pcVar4,(allocator *)&local_50);
          std::operator+(&local_b0,&local_d0,"/");
          std::operator+(&local_90,&local_b0,__lhs);
          std::__cxx11::string::~string((string *)&local_b0);
          std::__cxx11::string::~string((string *)&local_d0);
          bVar1 = cmsys::SystemTools::FileIsDirectory(&local_90);
          bVar2 = (byte)local_dc;
          if (bVar1) {
            pcVar4 = cmMakefile::GetCurrentBinaryDirectory((this->super_cmCommand).Makefile);
            std::__cxx11::string::string((string *)&local_50,pcVar4,(allocator *)&local_70);
            std::operator+(&local_d0,&local_50,"/");
            std::operator+(&local_b0,&local_d0,__lhs);
            std::__cxx11::string::~string((string *)&local_d0);
            std::__cxx11::string::~string((string *)&local_50);
            cmMakefile::AddSubDirectory
                      ((this->super_cmCommand).Makefile,&local_90,&local_b0,(bool)(bVar2 & 1),false)
            ;
LAB_00400a08:
            std::__cxx11::string::~string((string *)&local_b0);
          }
          else {
            bVar1 = cmsys::SystemTools::FileIsDirectory(__lhs);
            if (bVar1) {
              pcVar4 = cmMakefile::GetCurrentBinaryDirectory((this->super_cmCommand).Makefile);
              std::__cxx11::string::string((string *)&local_50,pcVar4,&local_e1);
              std::operator+(&local_d0,&local_50,"/");
              cmsys::SystemTools::GetFilenameName(&local_70,__lhs);
              std::operator+(&local_b0,&local_d0,&local_70);
              std::__cxx11::string::~string((string *)&local_70);
              std::__cxx11::string::~string((string *)&local_d0);
              std::__cxx11::string::~string((string *)&local_50);
              cmMakefile::AddSubDirectory
                        ((this->super_cmCommand).Makefile,__lhs,&local_b0,(bool)(bVar2 & 1),false);
              goto LAB_00400a08;
            }
            std::__cxx11::string::string
                      ((string *)&local_b0,"Incorrect SUBDIRS command. Directory: ",
                       (allocator *)&local_d0);
            std::operator+(&local_d0,__lhs," does not exist.");
            std::__cxx11::string::append((string *)&local_b0);
            std::__cxx11::string::~string((string *)&local_d0);
            cmCommand::SetError(&this->super_cmCommand,&local_b0);
            std::__cxx11::string::~string((string *)&local_b0);
            local_e0 = 0;
          }
          args = local_d8;
          std::__cxx11::string::~string((string *)&local_90);
        }
      }
      pbVar3 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    }
    bVar2 = (byte)local_e0;
  }
  return (bool)(bVar2 & 1);
}

Assistant:

bool cmSubdirCommand::InitialPass(std::vector<std::string> const& args,
                                  cmExecutionStatus&)
{
  if (args.empty()) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }
  bool res = true;
  bool excludeFromAll = false;

  for (std::vector<std::string>::const_iterator i = args.begin();
       i != args.end(); ++i) {
    if (*i == "EXCLUDE_FROM_ALL") {
      excludeFromAll = true;
      continue;
    }
    if (*i == "PREORDER") {
      // Ignored
      continue;
    }

    // if they specified a relative path then compute the full
    std::string srcPath =
      std::string(this->Makefile->GetCurrentSourceDirectory()) + "/" + *i;
    if (cmSystemTools::FileIsDirectory(srcPath)) {
      std::string binPath =
        std::string(this->Makefile->GetCurrentBinaryDirectory()) + "/" + *i;
      this->Makefile->AddSubDirectory(srcPath, binPath, excludeFromAll, false);
    }
    // otherwise it is a full path
    else if (cmSystemTools::FileIsDirectory(*i)) {
      // we must compute the binPath from the srcPath, we just take the last
      // element from the source path and use that
      std::string binPath =
        std::string(this->Makefile->GetCurrentBinaryDirectory()) + "/" +
        cmSystemTools::GetFilenameName(*i);
      this->Makefile->AddSubDirectory(*i, binPath, excludeFromAll, false);
    } else {
      std::string error = "Incorrect SUBDIRS command. Directory: ";
      error += *i + " does not exist.";
      this->SetError(error);
      res = false;
    }
  }
  return res;
}